

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkparse.c
# Opt level: O0

int pk_use_ecparams(mbedtls_asn1_buf *params,mbedtls_pk_context_conflict *pk)

{
  mbedtls_pk_context_conflict pk_00;
  mbedtls_pk_context_conflict pk_01;
  mbedtls_pk_context_conflict pk_02;
  undefined8 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined8 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined8 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  int iVar10;
  mbedtls_ecp_keypair *pmVar11;
  undefined8 in_stack_ffffffffffffffd0;
  mbedtls_ecp_group_id local_28 [2];
  mbedtls_ecp_group_id grp_id;
  int ret;
  mbedtls_pk_context_conflict *pk_local;
  mbedtls_asn1_buf *params_local;
  
  local_28[1] = 0xffffff92;
  if (params->tag == 6) {
    _grp_id = pk;
    pk_local = (mbedtls_pk_context_conflict *)params;
    iVar10 = mbedtls_oid_get_ec_grp(params,local_28);
    if (iVar10 == 0) {
      uVar1 = _grp_id->pk_ctx;
      uVar2 = _grp_id->priv_id;
      uVar3 = *(undefined4 *)&_grp_id->field_0x14;
      pk_00.pk_ctx._4_4_ = uVar3;
      pk_00.pk_ctx._0_4_ = uVar2;
      pk_00.pk_info = (mbedtls_pk_info_t *)uVar1;
      pk_00._16_8_ = in_stack_ffffffffffffffd0;
      pmVar11 = mbedtls_pk_ec_ro(pk_00);
      if (((pmVar11->grp).id == MBEDTLS_ECP_DP_NONE) ||
         (uVar4 = _grp_id->pk_ctx, uVar5 = _grp_id->priv_id,
         uVar6 = *(undefined4 *)&_grp_id->field_0x14, pk_01.pk_ctx._4_4_ = uVar6,
         pk_01.pk_ctx._0_4_ = uVar5, pk_01.pk_info = (mbedtls_pk_info_t *)uVar4,
         pk_01._16_8_ = in_stack_ffffffffffffffd0, pmVar11 = mbedtls_pk_ec_ro(pk_01),
         (pmVar11->grp).id == local_28[0])) {
        uVar7 = _grp_id->pk_ctx;
        uVar8 = _grp_id->priv_id;
        uVar9 = *(undefined4 *)&_grp_id->field_0x14;
        pk_02.pk_ctx._4_4_ = uVar9;
        pk_02.pk_ctx._0_4_ = uVar8;
        pk_02.pk_info = (mbedtls_pk_info_t *)uVar7;
        pk_02._16_8_ = in_stack_ffffffffffffffd0;
        pmVar11 = mbedtls_pk_ec_rw(pk_02);
        params_local._4_4_ = mbedtls_ecp_group_load(&pmVar11->grp,local_28[0]);
      }
      else {
        params_local._4_4_ = -0x3d00;
      }
    }
    else {
      params_local._4_4_ = -0x3a00;
    }
  }
  else {
    params_local._4_4_ = -0x3d00;
  }
  return params_local._4_4_;
}

Assistant:

static int pk_use_ecparams(const mbedtls_asn1_buf *params, mbedtls_pk_context *pk)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    mbedtls_ecp_group_id grp_id;

    if (params->tag == MBEDTLS_ASN1_OID) {
        if (mbedtls_oid_get_ec_grp(params, &grp_id) != 0) {
            return MBEDTLS_ERR_PK_UNKNOWN_NAMED_CURVE;
        }
    } else {
#if defined(MBEDTLS_PK_PARSE_EC_EXTENDED)
        if ((ret = pk_group_id_from_specified(params, &grp_id)) != 0) {
            return ret;
        }
#else
        return MBEDTLS_ERR_PK_KEY_INVALID_FORMAT;
#endif
    }

#if defined(MBEDTLS_PK_USE_PSA_EC_DATA)
    ret = pk_update_psa_ecparams(pk, grp_id);
#else
    /* grp may already be initialized; if so, make sure IDs match */
    if (mbedtls_pk_ec_ro(*pk)->grp.id != MBEDTLS_ECP_DP_NONE &&
        mbedtls_pk_ec_ro(*pk)->grp.id != grp_id) {
        return MBEDTLS_ERR_PK_KEY_INVALID_FORMAT;
    }

    if ((ret = mbedtls_ecp_group_load(&(mbedtls_pk_ec_rw(*pk)->grp),
                                      grp_id)) != 0) {
        return ret;
    }
#endif /* MBEDTLS_PK_USE_PSA_EC_DATA */

    return ret;
}